

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeAttributesEncoderIdentifier
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          int32_t att_encoder_id)

{
  int iVar1;
  pointer pAVar2;
  int iVar3;
  undefined4 extraout_var;
  uchar *data;
  EncoderBuffer *this_00;
  int8_t att_data_id;
  char local_1c;
  uchar local_1b [3];
  
  local_1c = (char)(this->attribute_encoder_to_data_id_map_).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[att_encoder_id];
  EncoderBuffer::Encode<signed_char>
            ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_,&local_1c);
  if ((long)local_1c < 0) {
    local_1b[0] = (uchar)this->pos_traversal_method_;
  }
  else {
    iVar1 = (this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1c].attribute_index;
    iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    iVar1 = *(int *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x70) + 0xa8) +
                    (long)iVar1 * 4);
    pAVar2 = (this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b[0] = (uchar)pAVar2[local_1c].traversal_method;
    if ((iVar1 != 0) &&
       ((iVar1 != 1 || (pAVar2[local_1c].connectivity_data.no_interior_seams_ != true)))) {
      this_00 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
      data = local_1b + 1;
      local_1b[1] = 1;
      goto LAB_001325c2;
    }
  }
  this_00 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  data = local_1b + 2;
  local_1b[2] = 0;
LAB_001325c2:
  EncoderBuffer::Encode<unsigned_char>(this_00,data);
  EncoderBuffer::Encode<unsigned_char>
            ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_,local_1b);
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::
    EncodeAttributesEncoderIdentifier(int32_t att_encoder_id) {
  const int8_t att_data_id = attribute_encoder_to_data_id_map_[att_encoder_id];
  encoder_->buffer()->Encode(att_data_id);

  // Also encode the type of the encoder that we used.
  int32_t element_type = MESH_VERTEX_ATTRIBUTE;
  MeshTraversalMethod traversal_method;
  if (att_data_id >= 0) {
    const int32_t att_id = attribute_data_[att_data_id].attribute_index;
    element_type = GetEncoder()->mesh()->GetAttributeElementType(att_id);
    traversal_method = attribute_data_[att_data_id].traversal_method;
  } else {
    traversal_method = pos_traversal_method_;
  }
  if (element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_VERTEX_ATTRIBUTE));
  } else {
    // Per-corner encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_CORNER_ATTRIBUTE));
  }
  // Encode the mesh traversal method.
  encoder_->buffer()->Encode(static_cast<uint8_t>(traversal_method));
  return true;
}